

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

void __thiscall
icu_63::MessagePatternList<icu_63::MessagePattern::Part,_32>::copyFrom
          (MessagePatternList<icu_63::MessagePattern::Part,_32> *this,
          MessagePatternList<icu_63::MessagePattern::Part,_32> *other,int32_t length,
          UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  Part *pPVar3;
  Part *__src;
  UErrorCode *errorCode_local;
  int32_t length_local;
  MessagePatternList<icu_63::MessagePattern::Part,_32> *other_local;
  MessagePatternList<icu_63::MessagePattern::Part,_32> *this_local;
  
  UVar1 = ::U_SUCCESS(*errorCode);
  if ((UVar1 != '\0') && (0 < length)) {
    iVar2 = MaybeStackArray<icu_63::MessagePattern::Part,_32>::getCapacity(&this->a);
    if ((iVar2 < length) &&
       (pPVar3 = MaybeStackArray<icu_63::MessagePattern::Part,_32>::resize(&this->a,length,0),
       pPVar3 == (Part *)0x0)) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
      return;
    }
    pPVar3 = MaybeStackArray<icu_63::MessagePattern::Part,_32>::getAlias(&this->a);
    __src = MaybeStackArray<icu_63::MessagePattern::Part,_32>::getAlias(&other->a);
    memcpy(pPVar3,__src,(long)length << 4);
  }
  return;
}

Assistant:

void
MessagePatternList<T, stackCapacity>::copyFrom(
        const MessagePatternList<T, stackCapacity> &other,
        int32_t length,
        UErrorCode &errorCode) {
    if(U_SUCCESS(errorCode) && length>0) {
        if(length>a.getCapacity() && NULL==a.resize(length)) {
            errorCode=U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        uprv_memcpy(a.getAlias(), other.a.getAlias(), (size_t)length*sizeof(T));
    }
}